

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  char *in_RCX;
  char *address;
  int in_EDX;
  int sock;
  int family;
  int sock_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int family_00;
  int sock_04;
  int family_01;
  int sock_05;
  int sock_06;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  int in_ESI;
  char buf [3];
  nn_pollfd pfd [2];
  nn_thread thread;
  undefined1 local_3b [3];
  int local_38;
  undefined2 local_34;
  short local_32;
  int local_30;
  undefined2 local_2c;
  short local_2a;
  nn_thread local_28;
  
  iVar1 = test_socket_impl((char *)0x83,in_ESI,in_EDX,(int)in_RCX);
  iVar2 = iVar1;
  test_bind_impl((char *)0x84,iVar1,sock,in_RCX);
  sc = test_socket_impl((char *)0x85,iVar2,family,(int)in_RCX);
  test_connect_impl((char *)0x86,sc,sock_00,in_RCX);
  test_send_impl((char *)0x87,sc,sock_01,in_RCX);
  nn_sleep(100);
  local_34 = 3;
  address = (char *)(ulong)(uint)sc;
  local_30 = sc;
  local_2c = 3;
  local_38 = iVar1;
  iVar2 = nn_poll(&local_38,2,0xffffffff);
  if (iVar2 < 0) {
LAB_00102025:
    main_cold_11();
LAB_0010202a:
    main_cold_1();
LAB_0010202f:
    main_cold_2();
LAB_00102034:
    main_cold_3();
LAB_00102039:
    main_cold_4();
LAB_0010203e:
    main_cold_5();
LAB_00102043:
    main_cold_6();
LAB_00102048:
    main_cold_7();
  }
  else {
    if (iVar2 != 2) goto LAB_0010202a;
    if (local_32 != 3) goto LAB_0010202f;
    if (local_2a != 2) goto LAB_00102034;
    test_close_impl((char *)0x92,sc,sock_02);
    test_close_impl((char *)0x93,iVar1,sock_03);
    iVar1 = test_socket_impl((char *)0x96,iVar1,family_00,(int)address);
    iVar2 = iVar1;
    test_bind_impl((char *)0x97,iVar1,sock_04,address);
    sc = test_socket_impl((char *)0x98,iVar2,family_01,(int)address);
    test_connect_impl((char *)0x99,sc,sock_05,address);
    iVar2 = getevents(iVar1,3,1000);
    if (iVar2 != 2) goto LAB_00102039;
    iVar2 = getevents(iVar1,1,10);
    if (iVar2 != 0) goto LAB_0010203e;
    test_send_impl((char *)0xa6,sc,sock_06,address);
    iVar2 = getevents(iVar1,1,1000);
    if (iVar2 != 1) goto LAB_00102043;
    test_recv_impl((char *)0xab,iVar1,sock_07,address);
    iVar2 = getevents(iVar1,1,10);
    if (iVar2 != 0) goto LAB_00102048;
    nn_thread_init(&local_28,routine1,(void *)0x0);
    iVar2 = getevents(iVar1,1,1000);
    if (iVar2 == 1) {
      test_recv_impl((char *)0xb3,iVar1,sock_08,address);
      nn_thread_term(&local_28);
      nn_thread_init(&local_28,routine2,(void *)0x0);
      iVar2 = getevents(iVar1,1,1000);
      if (iVar2 != 1) goto LAB_00102052;
      iVar2 = nn_recv(iVar1,local_3b,3,0);
      if (iVar2 < 0) {
        iVar2 = nn_errno();
        if (iVar2 == 0x9523dfd) {
          nn_thread_term(&local_28);
          test_close_impl((char *)0xbf,sc,sock_09);
          test_close_impl((char *)0xc0,iVar1,sock_10);
          return 0;
        }
      }
      main_cold_10();
      goto LAB_00102025;
    }
  }
  main_cold_8();
LAB_00102052:
  main_cold_9();
}

Assistant:

int main ()
{
    int rc;
    int sb;
    char buf [3];
    struct nn_thread thread;
    struct nn_pollfd pfd [2];

    /* Test nn_poll() function. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    test_send (sc, "ABC");
    nn_sleep (100);
    pfd [0].fd = sb;
    pfd [0].events = NN_POLLIN | NN_POLLOUT;
    pfd [1].fd = sc;
    pfd [1].events = NN_POLLIN | NN_POLLOUT;
    rc = nn_poll (pfd, 2, -1);
    errno_assert (rc >= 0);
    nn_assert (rc == 2);
    nn_assert (pfd [0].revents == (NN_POLLIN | NN_POLLOUT));
    nn_assert (pfd [1].revents == NN_POLLOUT);
    test_close (sc);
    test_close (sb);

    /*  Create a simple topology. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    /*  Check the initial state of the socket. */
    rc = getevents (sb, NN_IN | NN_OUT, 1000);
    nn_assert (rc == NN_OUT);

    /*  Poll for IN when there's no message available. The call should
        time out. */
    rc = getevents (sb, NN_IN, 10);
    nn_assert (rc == 0);

    /*  Send a message and start polling. This time IN event should be
        signaled. */
    test_send (sc, "ABC");
    rc = getevents (sb, NN_IN, 1000);
    nn_assert (rc == NN_IN);

    /*  Receive the message and make sure that IN is no longer signaled. */
    test_recv (sb, "ABC");
    rc = getevents (sb, NN_IN, 10);
    nn_assert (rc == 0);

    /*  Check signalling from a different thread. */
    nn_thread_init (&thread, routine1, NULL);
    rc = getevents (sb, NN_IN, 1000);
    nn_assert (rc == NN_IN);
    test_recv (sb, "ABC");
    nn_thread_term (&thread);

    /*  Check terminating the library from a different thread. */
    nn_thread_init (&thread, routine2, NULL);
    rc = getevents (sb, NN_IN, 1000);
    nn_assert (rc == NN_IN);
    rc = nn_recv (sb, buf, sizeof (buf), 0);
    nn_assert (rc < 0 && nn_errno () == ETERM);
    nn_thread_term (&thread);

    /*  Clean up. */
    test_close (sc);
    test_close (sb);

    return 0;
}